

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O2

IntrinsicResult MiniScript::intrinsic_split(Context *context,IntrinsicResult partialResult)

{
  Context *pCVar1;
  int32_t iVar2;
  ulong uVar3;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *pDVar4;
  long lVar5;
  ulong posB;
  long lVar6;
  ValueList result;
  String delim;
  String self;
  Value local_b0;
  Context *local_a0;
  anon_union_8_3_2f476f46_for_data local_98;
  Value local_90;
  String local_80;
  String local_70;
  anon_union_8_3_2f476f46_for_data local_60 [2];
  String local_50;
  Value local_40;
  
  String::String(&local_50,"self");
  Context::GetVar((Context *)&delim,(String *)partialResult.rs,(LocalOnlyMode)&local_50);
  Value::ToString((Value *)&self,(Machine *)&delim);
  Value::~Value((Value *)&delim);
  String::~String(&local_50);
  String::String(&local_70,"delimiter");
  Context::GetVar((Context *)&result,(String *)partialResult.rs,(LocalOnlyMode)&local_70);
  Value::ToString((Value *)&delim,(Machine *)&result);
  Value::~Value((Value *)&result);
  String::~String(&local_70);
  String::String(&local_80,"maxCount");
  local_a0 = context;
  Context::GetVar((Context *)&result,(String *)partialResult.rs,(LocalOnlyMode)&local_80);
  iVar2 = Value::IntValue((Value *)&result);
  Value::~Value((Value *)&result);
  String::~String(&local_80);
  result.ls = (ListStorage<MiniScript::Value> *)0x0;
  result.isTemp = false;
  local_98 = (anon_union_8_3_2f476f46_for_data)(long)(iVar2 + -1);
  posB = 0;
  do {
    if (self.ss == (StringStorage *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (self.ss)->dataSize - 1;
    }
    if (uVar3 <= posB) {
      Value::Value(&local_90,&result);
      pCVar1 = local_a0;
      IntrinsicResult::IntrinsicResult((IntrinsicResult *)local_a0,&local_90,true);
      Value::~Value(&local_90);
      List<MiniScript::Value>::release(&result);
      String::~String(&delim);
      String::~String(&self);
      return (IntrinsicResult)(IntrinsicResultStorage *)pCVar1;
    }
    if (iVar2 < 0) {
LAB_00125c62:
      if ((delim.ss == (StringStorage *)0x0) || ((delim.ss)->dataSize < 2)) {
        lVar6 = posB + 1;
      }
      else {
        lVar6 = String::IndexOfB(&self,&delim,posB);
      }
LAB_00125c8e:
      if (lVar6 < 0) {
        if (self.ss == (StringStorage *)0x0) goto LAB_00125ca6;
        lVar6 = (self.ss)->dataSize - 1;
      }
    }
    else {
      if (result.ls == (ListStorage<MiniScript::Value> *)0x0) {
        pDVar4 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
      }
      else {
        pDVar4 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)
                 ((result.ls)->super_SimpleVector<MiniScript::Value>).mQtyItems;
      }
      if (pDVar4 != (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_98.ref)
      goto LAB_00125c62;
      if (self.ss != (StringStorage *)0x0) {
        lVar6 = (self.ss)->dataSize - 1;
        goto LAB_00125c8e;
      }
LAB_00125ca6:
      lVar6 = 0;
    }
    String::SubstringB((String *)local_60,(long)&self,posB);
    local_b0.type = String;
    local_b0.noInvoke = false;
    local_b0.localOnly = Off;
    local_b0.data = local_60[0];
    if ((Machine *)local_60[0].ref == (Machine *)0x0) {
      local_b0.data = (anon_union_8_3_2f476f46_for_data)Value::emptyString._8_8_;
    }
    if ((Machine *)local_b0.data.ref != (Machine *)0x0) {
      (local_b0.data.ref)->refCount = (local_b0.data.ref)->refCount + 1;
    }
    List<MiniScript::Value>::Add((List<MiniScript::Value> *)&result,&local_b0);
    Value::~Value(&local_b0);
    String::~String((String *)local_60);
    if (delim.ss == (StringStorage *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = (delim.ss)->dataSize - 1;
    }
    if (self.ss == (StringStorage *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (self.ss)->dataSize - 1;
    }
    posB = lVar5 + lVar6;
    if (((delim.ss != (StringStorage *)0x0) && (posB == uVar3)) && (1 < (delim.ss)->dataSize)) {
      Value::Value(&local_40,(Value *)Value::emptyString);
      List<MiniScript::Value>::Add((List<MiniScript::Value> *)&result,&local_40);
      Value::~Value(&local_40);
    }
  } while( true );
}

Assistant:

static IntrinsicResult intrinsic_split(Context *context, IntrinsicResult partialResult) {
		String self = context->GetVar("self").ToString();
		String delim = context->GetVar("delimiter").ToString();
		long maxCount = context->GetVar("maxCount").IntValue();
		ValueList result;
		long posB = 0;
		while (posB < self.LengthB()) {
			long nextPos;
			if (maxCount >= 0 and result.Count() == maxCount - 1) nextPos = self.LengthB();
			else if (delim.empty()) nextPos = posB + 1;
			else nextPos = self.IndexOfB(delim, posB);
			if (nextPos < 0) nextPos = self.LengthB();
			result.Add(self.SubstringB(posB, nextPos - posB));
			posB = nextPos + delim.LengthB();
			if (posB == self.LengthB() && !delim.empty()) result.Add(Value::emptyString);
		}
		return IntrinsicResult(result);
	}